

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_address.cpp
# Opt level: O2

int CfdFreeMultisigScriptHandle(void *handle,void *multisig_handle)

{
  allocator local_39;
  string local_38;
  
  cfd::Initialize();
  std::__cxx11::string::string((string *)&local_38,"MultisigScript",&local_39);
  cfd::capi::FreeBuffer(multisig_handle,&local_38,0xa58);
  std::__cxx11::string::~string((string *)&local_38);
  return 0;
}

Assistant:

int CfdFreeMultisigScriptHandle(void* handle, void* multisig_handle) {
  try {
    cfd::Initialize();
    FreeBuffer(
        multisig_handle, kPrefixMultisigScript, sizeof(CfdCapiMultisigScript));
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}